

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O1

set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> * __thiscall
mir::inst::PhiInst::useVars
          (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
           *__return_storage_ptr__,PhiInst *this)

{
  _Rb_tree_header *p_Var1;
  pointer pVVar2;
  pointer pVVar3;
  VarId var;
  VarId local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  pVVar2 = (this->vars).super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pVVar3 = (this->vars).super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                ._M_impl.super__Vector_impl_data._M_start; pVVar3 != pVVar2; pVVar3 = pVVar3 + 1) {
    local_38.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
    local_38.id = pVVar3->id;
    std::
    _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
    ::_M_insert_unique<mir::inst::VarId_const&>
              ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                *)__return_storage_ptr__,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<VarId> useVars() const {
    auto s = std::set<VarId>();
    for (auto var : vars) {
      s.insert(var);
    }
    return s;
  }